

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
* __thiscall
imrt::ApertureILS::getOrderedApertureNeighbors
          (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
           *__return_storage_ptr__,ApertureILS *this,Plan *P)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  _List_node_base *p_Var4;
  pair<int,_int> pVar5;
  pair<int,_int> pVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int i;
  Station *this_00;
  pair<int,_int> pVar10;
  _List_node_base *local_b0;
  vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
  *local_a8;
  Station *local_a0;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_98;
  ulong local_88;
  uint local_7c;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  a_list;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  pair<bool,_std::pair<imrt::Station_*,_int>_> target_beam;
  
  __x = Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list(&stations,__x);
  (*(this->super_ILS)._vptr_ILS[7])(&target_beam,this,P);
  a_list.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  a_list.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a_list.
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0 = stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
  local_a0 = target_beam.second.first;
  this_00 = target_beam.second.first;
  local_a8 = (vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
              *)__return_storage_ptr__;
  for (uVar9 = 0;
      uVar9 < stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
              _M_node._M_size; uVar9 = uVar9 + 1) {
    p_Var4 = local_b0[1]._M_next;
    uVar3 = (uint)uVar9;
    if (*(int *)&p_Var4->_M_prev != this_00->angle) {
      local_88 = uVar9;
      local_7c = (uint)P;
      for (lVar7 = 0; uVar9 = local_88, lVar7 < *(int *)&p_Var4[4]._M_next; lVar7 = lVar7 + 1) {
        pVar10 = (pair<int,_int>)(lVar7 << 0x20 | local_88);
        lVar8 = 0;
        while( true ) {
          iVar2 = Collimator::getXdim((Collimator *)p_Var4[0xb]._M_next);
          if (iVar2 <= lVar8) break;
          iVar2 = (int)lVar7;
          pVar5 = Station::getApertureShape((Station *)local_b0[1]._M_next,iVar2,(int)lVar8);
          pVar6 = Collimator::getActiveRange
                            ((Collimator *)local_b0[1]._M_next[0xb]._M_next,(int)lVar8,
                             *(int *)&(local_b0[1]._M_next)->_M_prev);
          if (pVar6.first != -1) {
            uVar3 = Station::getBeamIndex
                              ((Station *)local_b0[1]._M_next,
                               (pair<int,_int>)(((long)pVar5 << 0x20) + lVar8));
            bVar1 = Station::isOpenBeamlet((Station *)local_b0[1]._M_next,uVar3,iVar2);
            local_98.first = pVar10;
            if (bVar1) {
              local_98.second = (pair<int,_int>)(((ulong)uVar3 << 0x20) + 0xffffffff);
              std::
              vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
              ::emplace_back<std::pair<std::pair<int,int>,std::pair<int,int>>>
                        ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                          *)&a_list,&local_98);
            }
            else {
              local_98.second = (pair<int,_int>)((ulong)uVar3 << 0x20 | 1);
              std::
              vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
              ::emplace_back<std::pair<std::pair<int,int>,std::pair<int,int>>>
                        ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                          *)&a_list,&local_98);
            }
            if (pVar5.first != pVar5.second) {
              uVar3 = Station::getBeamIndex
                                ((Station *)local_b0[1]._M_next,
                                 (pair<int,_int>)(((ulong)pVar5 & 0xffffffff00000000) + lVar8));
              bVar1 = Station::isOpenBeamlet((Station *)local_b0[1]._M_next,uVar3,iVar2);
              if (bVar1) {
                local_98.second = (pair<int,_int>)((ulong)uVar3 << 0x20 | 0xfffffffe);
                local_98.first = pVar10;
                std::
                vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                ::emplace_back<std::pair<std::pair<int,int>,std::pair<int,int>>>
                          ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                            *)&a_list,&local_98);
              }
              else {
                local_98.second = (pair<int,_int>)((ulong)uVar3 << 0x20 | 1);
                local_98.first = pVar10;
                std::
                vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                ::emplace_back<std::pair<std::pair<int,int>,std::pair<int,int>>>
                          ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                            *)&a_list,&local_98);
              }
            }
          }
          lVar8 = lVar8 + 1;
          p_Var4 = local_b0[1]._M_next;
        }
        p_Var4 = local_b0[1]._M_next;
        this_00 = local_a0;
      }
      std::__advance<std::_List_iterator<imrt::Station*>,long>(&local_b0,1);
      uVar3 = local_7c;
    }
    P = (Plan *)(ulong)uVar3;
  }
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>>
            ((__normal_iterator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              )a_list.
               super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              )a_list.
               super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  local_88 = (ulong)P & 0xffffffff;
  for (lVar7 = 0; lVar7 < this_00->max_apertures; lVar7 = lVar7 + 1) {
    pVar10 = (pair<int,_int>)((lVar7 << 0x20) + local_88);
    lVar8 = 0;
    while( true ) {
      iVar2 = Collimator::getXdim(this_00->collimator);
      this_00 = local_a0;
      if (iVar2 <= lVar8) break;
      pVar5 = Collimator::getActiveRange(local_a0->collimator,(int)lVar8,local_a0->angle);
      if (pVar5.first != -1) {
        iVar2 = (int)lVar7;
        pVar5 = Station::getApertureShape(this_00,iVar2,(int)lVar8);
        uVar3 = Station::getBeamIndex(this_00,(pair<int,_int>)(((long)pVar5 << 0x20) + lVar8));
        bVar1 = Station::isOpenBeamlet(local_a0,uVar3,iVar2);
        local_98.first = pVar10;
        if (bVar1) {
          local_98.second = (pair<int,_int>)(((ulong)uVar3 << 0x20) + 0xffffffff);
          std::
          vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
          ::emplace_back<std::pair<std::pair<int,int>,std::pair<int,int>>>(local_a8,&local_98);
        }
        else {
          local_98.second = (pair<int,_int>)((ulong)uVar3 << 0x20 | 1);
          std::
          vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
          ::emplace_back<std::pair<std::pair<int,int>,std::pair<int,int>>>(local_a8,&local_98);
        }
        this_00 = local_a0;
        if (pVar5.first != pVar5.second) {
          uVar3 = Station::getBeamIndex
                            (local_a0,(pair<int,_int>)(((ulong)pVar5 & 0xffffffff00000000) + lVar8))
          ;
          bVar1 = Station::isOpenBeamlet(local_a0,uVar3,iVar2);
          if (bVar1) {
            local_98.second = (pair<int,_int>)((ulong)uVar3 << 0x20 | 0xfffffffe);
            local_98.first = pVar10;
            std::
            vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
            ::emplace_back<std::pair<std::pair<int,int>,std::pair<int,int>>>(local_a8,&local_98);
            this_00 = local_a0;
          }
          else {
            local_98.second = (pair<int,_int>)((ulong)uVar3 << 0x20 | 1);
            local_98.first = pVar10;
            std::
            vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
            ::emplace_back<std::pair<std::pair<int,int>,std::pair<int,int>>>(local_a8,&local_98);
            this_00 = local_a0;
          }
        }
      }
      lVar8 = lVar8 + 1;
    }
  }
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>>
            (*(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)local_a8,
             *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_a8 + 8));
  lVar7 = 0;
  for (uVar9 = 0;
      uVar9 < (ulong)((long)a_list.
                            super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)a_list.
                            super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar9 = uVar9 + 1) {
    std::
    vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                 *)local_a8,
                (value_type *)
                ((long)&((a_list.
                          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first).first + lVar7));
    lVar7 = lVar7 + 0x10;
  }
  std::
  _Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::~_Vector_base(&a_list.
                   super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                 );
  std::__cxx11::_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>::_M_clear
            (&stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>);
  return (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          *)local_a8;
}

Assistant:

vector < pair<pair<int, int>, pair<int, int>> > ApertureILS::getOrderedApertureNeighbors(Plan &P){
  list<Station*> stations = P.get_stations();
  
  pair<bool, pair<Station*, int>> target_beam = getBestLSBeamlet(P);
  Station * target_station = target_beam.second.first;
  int s_target;
  
  vector<pair< pair<int,int> , pair<int, int> >> a_list, final_list;
  list<Station*>::iterator st;
  int beamlet;
  st = stations.begin();
  
  pair <int,int> pattern;
  pair <int,int> active;
  
  for (int s = 0; s < stations.size(); s++) {
    if ((*st)->getAngle() == target_station->getAngle()){
      s_target=s;
      continue;
    }
    for (int a = 0; a < (*st)->getNbApertures(); a++){
      for (int k = 0; k< (*st)->collimator.getXdim() ; k++){
        //One pair -k (-row) for closing aperture
        //One pair (k) (row) for opening aperture
        pattern = (*st)->getApertureShape(a, k);
        active = (*st)->collimator.getActiveRange(k, (*st)->getAngle());
        if (active.first == -1) continue;
        beamlet = (*st)->getBeamIndex(make_pair(k,pattern.first));
        if((*st)->isOpenBeamlet(beamlet, a))
          a_list.push_back(make_pair(make_pair(s,a) , make_pair(-1,beamlet)));
        else 
          a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));
        
        if (pattern.first != pattern.second) {
          beamlet = (*st)->getBeamIndex(make_pair(k,pattern.second));
          if((*st)->isOpenBeamlet(beamlet, a))
            a_list.push_back(make_pair(make_pair(s,a) , make_pair(-2,beamlet)));
          else 
            a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));
        }
      }
    }
    std::advance(st,1);
  }
  std::random_shuffle(a_list.begin(), a_list.end());
  
  // Add target station neighbors
  for (int a = 0; a < target_station->getNbApertures(); a++) {
    for (int k = 0; k< target_station->collimator.getXdim() ; k++) {
      active = target_station->collimator.getActiveRange(k, target_station->getAngle());
      if (active.first == -1) continue;
      pattern = target_station->getApertureShape(a, k);
      
      beamlet = target_station->getBeamIndex(make_pair(k,pattern.first));
      if (target_station->isOpenBeamlet(beamlet, a))
        final_list.push_back (make_pair(make_pair(s_target,a) , make_pair(-1,beamlet)));
      else 
        final_list.push_back (make_pair(make_pair(s_target,a) , make_pair( 1,beamlet)));
      
      if (pattern.first != pattern.second) {
        beamlet = target_station->getBeamIndex(make_pair(k,pattern.second));
        if (target_station->isOpenBeamlet(beamlet, a))
          final_list.push_back (make_pair(make_pair(s_target,a) , make_pair(-2,beamlet)));
        else 
          final_list.push_back(make_pair(make_pair(s_target,a) , make_pair( 1,beamlet)));
      }
    }
  }
  std::random_shuffle(final_list.begin(), final_list.end());
  for (int i=0; i<a_list.size(); i++) {
    final_list.push_back(a_list[i]);
  }
  
  return(final_list);
}